

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O1

void __thiscall
HighsSymmetryDetection::switchToNextNode(HighsSymmetryDetection *this,HighsInt backtrackDepth)

{
  pointer *ppNVar1;
  uint cellCreationStackPos;
  pointer piVar2;
  pointer piVar3;
  pointer pNVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  
  piVar2 = (this->cellCreationStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->cellCreationStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  std::vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>::resize
            (&this->nodeStack,(long)backtrackDepth);
  if (backtrackDepth != 0) {
    uVar8 = (ulong)((long)piVar3 - (long)piVar2) >> 2;
    do {
      pNVar4 = (this->nodeStack).
               super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      backtrack(this,pNVar4[-1].stackStart,(HighsInt)uVar8);
      cellCreationStackPos = pNVar4[-1].stackStart;
      uVar8 = (ulong)cellCreationStackPos;
      iVar6 = (int)((ulong)((long)(this->nodeStack).
                                  super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->nodeStack).
                                 super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
      iVar7 = this->firstPathDepth;
      if (iVar6 <= this->firstPathDepth) {
        iVar7 = iVar6;
      }
      this->firstPathDepth = iVar7;
      if (this->bestPathDepth < iVar6) {
        iVar6 = this->bestPathDepth;
      }
      this->bestPathDepth = iVar6;
      iVar7 = pNVar4[-1].certificateEnd;
      if (this->firstLeavePrefixLen < pNVar4[-1].certificateEnd) {
        iVar7 = this->firstLeavePrefixLen;
      }
      this->firstLeavePrefixLen = iVar7;
      iVar7 = pNVar4[-1].certificateEnd;
      iVar6 = this->bestLeavePrefixLen;
      if (iVar7 <= this->bestLeavePrefixLen) {
        iVar6 = iVar7;
      }
      this->bestLeavePrefixLen = iVar6;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&this->currNodeCertificate,(long)iVar7);
      bVar5 = determineNextToDistinguish(this);
      if (bVar5) {
        cleanupBacktrack(this,cellCreationStackPos);
        bVar5 = distinguishVertex(this,pNVar4[-1].targetCell);
        if (!bVar5) goto LAB_00301392;
        bVar5 = partitionRefinement(this);
        if (!bVar5) {
          uVar8 = (ulong)((long)(this->cellCreationStack).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(this->cellCreationStack).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2;
          goto LAB_0030139a;
        }
        createNode(this);
        bVar5 = false;
      }
      else {
LAB_00301392:
        ppNVar1 = &(this->nodeStack).
                   super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppNVar1 = *ppNVar1 + -1;
LAB_0030139a:
        bVar5 = true;
      }
    } while ((bVar5) &&
            ((this->nodeStack).
             super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->nodeStack).
             super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
             ._M_impl.super__Vector_impl_data._M_finish));
  }
  return;
}

Assistant:

void HighsSymmetryDetection::switchToNextNode(HighsInt backtrackDepth) {
  HighsInt stackEnd = cellCreationStack.size();
  // we need to backtrack the datastructures
  nodeStack.resize(backtrackDepth);
  if (backtrackDepth == 0) return;
  do {
    Node& currNode = nodeStack.back();
    backtrack(currNode.stackStart, stackEnd);
    stackEnd = currNode.stackStart;
    firstPathDepth = std::min((HighsInt)nodeStack.size(), firstPathDepth);
    bestPathDepth = std::min((HighsInt)nodeStack.size(), bestPathDepth);
    firstLeavePrefixLen =
        std::min(currNode.certificateEnd, firstLeavePrefixLen);
    bestLeavePrefixLen = std::min(currNode.certificateEnd, bestLeavePrefixLen);
    currNodeCertificate.resize(currNode.certificateEnd);
    if (!determineNextToDistinguish()) {
      nodeStack.pop_back();
      continue;
    }

    // call cleanup backtrack with the final stackEnd
    // so that all hashes are up to date and the link arrays do not contain
    // chains anymore
    cleanupBacktrack(stackEnd);
    HighsInt targetCell = currNode.targetCell;

    if (!distinguishVertex(targetCell)) {
      // if distinguishing the next vertex fails, it means that its certificate
      // value is lexicographically larger than that of the best leave
      nodeStack.pop_back();
      continue;
    }

    if (!partitionRefinement()) {
      stackEnd = cellCreationStack.size();
      continue;
    }

    createNode();
    break;
  } while (!nodeStack.empty());
}